

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamANCF_3333::ComputeNF
          (ChElementBeamANCF_3333 *this,double xi,double eta,double zeta,ChVectorDynamic<> *Qi,
          double *detJ,ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  void *pvVar10;
  undefined8 *puVar11;
  double *pdVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  ChMatrix33<double> J_Cxi;
  VectorN G_C;
  VectorN G_B;
  VectorN G_A;
  ChMatrix33<double> J_Cxi_Inv;
  MatrixNx3 QiCompact;
  VectorN Sxi_compact;
  MatrixNx3c Sxi_D;
  Matrix3xN e_bar;
  Matrix<double,_3,_3,_1,_3,_3> local_480;
  double local_438 [4];
  double local_418;
  double dStack_410;
  double local_408;
  double dStack_400;
  double local_3f8;
  assign_op<double,_double> local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined8 local_3a8;
  SrcXprType local_398;
  double dStack_390;
  double local_388;
  double dStack_380;
  double local_378;
  double dStack_370;
  double local_368;
  double dStack_360;
  undefined8 local_358;
  Matrix<double,_3,_3,_1,_3,_3> local_350;
  Matrix<double,_9,_3,_1,_9,_3> local_308;
  VectorN local_230;
  undefined1 local_1e8 [32];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  double local_1a8;
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  undefined1 local_180 [16];
  undefined1 local_170 [16];
  double local_160;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  double local_118;
  Matrix3xN local_108;
  
  Calc_Sxi_compact(this,&local_230,xi,eta,zeta);
  dVar4 = (double)(F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows;
  if (2 < (long)dVar4) {
    local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.array[1]
         = (double)(F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
    local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.array[2]
         = 1.48219693752374e-323;
    local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.array[5]
         = 0.0;
    local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.array[0]
         = (double)&local_230;
    local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.array[4]
         = (double)F;
    local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.array[7]
         = dVar4;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,9,3,1,9,3>,Eigen::Product<Eigen::Matrix<double,9,1,0,9,1>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>,0>,Eigen::internal::assign_op<double,double>>
              (&local_308,
               (Product<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_0>
                *)&local_108,(assign_op<double,_double> *)local_1e8,(type)0x0);
    if ((Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
        0x1b) {
      pdVar12 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      if (pdVar12 != (double *)0x0) {
        free((void *)pdVar12[-1]);
      }
      pvVar10 = malloc(0x118);
      if (pvVar10 == (void *)0x0) {
        pdVar12 = (double *)0x0;
      }
      else {
        *(void **)(((ulong)pvVar10 & 0xffffffffffffffc0) + 0x38) = pvVar10;
        pdVar12 = (double *)(((ulong)pvVar10 & 0xffffffffffffffc0) + 0x40);
      }
      if (pdVar12 == (double *)0x0) {
        puVar11 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar11 = std::ostream::_M_insert<bool>;
        __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
           pdVar12;
      (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0x1b;
    }
    if ((Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
        0x1b) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Map<Eigen::Matrix<double, 27, 1>>, T1 = double, T2 = double]"
                   );
    }
    pdVar12 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    uVar13 = 0xfffffffffffffff8;
    do {
      dVar4 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.
              m_data.array[uVar13 + 9];
      dVar2 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.
              m_data.array[uVar13 + 10];
      dVar3 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.
              m_data.array[uVar13 + 0xb];
      dVar6 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.
              m_data.array[uVar13 + 0xc];
      dVar7 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.
              m_data.array[uVar13 + 0xd];
      dVar8 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.
              m_data.array[uVar13 + 0xe];
      dVar9 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.
              m_data.array[uVar13 + 0xf];
      pdVar1 = pdVar12 + uVar13 + 8;
      *pdVar1 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.
                m_data.array[uVar13 + 8];
      pdVar1[1] = dVar4;
      pdVar1[2] = dVar2;
      pdVar1[3] = dVar3;
      pdVar1[4] = dVar6;
      pdVar1[5] = dVar7;
      pdVar1[6] = dVar8;
      pdVar1[7] = dVar9;
      uVar13 = uVar13 + 8;
    } while (uVar13 < 0x10);
    lVar14 = 0x18;
    do {
      pdVar12[lVar14] =
           local_308.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
           array[lVar14];
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x1b);
    CalcCoordMatrix(this,&local_108);
    Calc_Sxi_D(this,(MatrixNx3c *)local_1e8,xi,eta,zeta);
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,3,0,9,3>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::evalTo<Eigen::Matrix<double,3,3,1,3,3>>(&local_480,&local_108,(MatrixNx3c *)local_1e8);
    local_398.m_xpr = &local_480;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&local_350,&local_398,local_3e8);
    auVar17._8_8_ = 0;
    auVar17._0_8_ =
         local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar17 = vmovddup_avx512vl(auVar17);
    auVar18 = vmulpd_avx512vl(auVar17,local_158);
    local_398.m_xpr =
         (XprTypeNested)
         (local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[0] * local_1e8._0_8_ +
          local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[3] * local_1a0._0_8_ + auVar18._0_8_);
    dStack_390 = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[0] * local_1e8._8_8_ +
                 local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[3] * local_1a0._8_8_ + auVar18._8_8_;
    auVar18 = vmulpd_avx512vl(auVar17,local_148);
    local_388 = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[3] * local_190._0_8_ +
                local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[0] * local_1e8._16_8_ + auVar18._0_8_;
    dStack_380 = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[3] * local_190._8_8_ +
                 local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[0] * local_1e8._24_8_ + auVar18._8_8_;
    auVar18 = vmulpd_avx512vl(auVar17,local_138);
    local_378 = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[0] * local_1c8._0_8_ +
                local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[3] * local_180._0_8_ + auVar18._0_8_;
    dStack_370 = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[0] * local_1c8._8_8_ +
                 local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[3] * local_180._8_8_ + auVar18._8_8_;
    auVar18 = vmulpd_avx512vl(auVar17,local_128);
    local_368 = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[0] * local_1b8._0_8_ +
                local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[3] * local_170._0_8_ + auVar18._0_8_;
    dStack_360 = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[0] * local_1b8._8_8_ +
                 local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[3] * local_170._8_8_ + auVar18._8_8_;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = local_160;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = local_118;
    auVar17 = vmulsd_avx512f(auVar17,auVar36);
    auVar37._8_8_ = 0;
    auVar37._0_8_ =
         local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0] * local_1a8 +
         local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3] * local_160;
    auVar17 = vaddsd_avx512f(auVar37,auVar17);
    local_358 = auVar17._0_8_;
    auVar38._8_8_ =
         local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar38._0_8_ =
         local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar17 = vmulpd_avx512vl(local_1e8._0_16_,auVar38);
    auVar18._8_8_ = 0;
    auVar18._0_8_ =
         local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar18 = vmovddup_avx512vl(auVar18);
    auVar19 = vmulpd_avx512vl(local_1a0,auVar18);
    auVar17 = vaddpd_avx512vl(auVar17,auVar19);
    auVar19._8_8_ = 0;
    auVar19._0_8_ =
         local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar19 = vmovddup_avx512vl(auVar19);
    auVar20 = vmulpd_avx512vl(local_158,auVar19);
    auVar17 = vaddpd_avx512vl(auVar17,auVar20);
    local_3e8[0] = (assign_op<double,_double>)auVar17[0];
    local_3e8[1] = (assign_op<double,_double>)auVar17[1];
    local_3e8[2] = (assign_op<double,_double>)auVar17[2];
    local_3e8[3] = (assign_op<double,_double>)auVar17[3];
    local_3e8[4] = (assign_op<double,_double>)auVar17[4];
    local_3e8[5] = (assign_op<double,_double>)auVar17[5];
    local_3e8[6] = (assign_op<double,_double>)auVar17[6];
    local_3e8[7] = (assign_op<double,_double>)auVar17[7];
    local_3e8[8] = (assign_op<double,_double>)auVar17[8];
    local_3e8[9] = (assign_op<double,_double>)auVar17[9];
    local_3e8[10] = (assign_op<double,_double>)auVar17[10];
    local_3e8[0xb] = (assign_op<double,_double>)auVar17[0xb];
    local_3e8[0xc] = (assign_op<double,_double>)auVar17[0xc];
    local_3e8[0xd] = (assign_op<double,_double>)auVar17[0xd];
    local_3e8[0xe] = (assign_op<double,_double>)auVar17[0xe];
    local_3e8[0xf] = (assign_op<double,_double>)auVar17[0xf];
    auVar17 = vmulpd_avx512vl(local_1e8._16_16_,auVar38);
    auVar20 = vmulpd_avx512vl(local_190,auVar18);
    auVar17 = vaddpd_avx512vl(auVar17,auVar20);
    auVar20 = vmulpd_avx512vl(local_148,auVar19);
    local_3d8 = vaddpd_avx512vl(auVar17,auVar20);
    auVar17 = vmulpd_avx512vl(local_1c8,auVar38);
    auVar20 = vmulpd_avx512vl(local_180,auVar18);
    auVar17 = vaddpd_avx512vl(auVar17,auVar20);
    auVar20 = vmulpd_avx512vl(local_138,auVar19);
    local_3c8 = vaddpd_avx512vl(auVar17,auVar20);
    auVar17 = vmulpd_avx512vl(local_1b8,auVar38);
    auVar20 = vmulpd_avx512vl(local_170,auVar18);
    auVar17 = vaddpd_avx512vl(auVar17,auVar20);
    auVar20 = vmulpd_avx512vl(local_128,auVar19);
    local_3b8 = vaddpd_avx512vl(auVar17,auVar20);
    auVar17 = vmulsd_avx512f(auVar35,auVar18);
    auVar39._8_8_ = 0;
    auVar39._0_8_ =
         local_1a8 *
         local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar17 = vaddsd_avx512f(auVar39,auVar17);
    auVar18 = vmulsd_avx512f(auVar36,auVar19);
    auVar17 = vaddsd_avx512f(auVar17,auVar18);
    local_3a8 = auVar17._0_8_;
    auVar20._8_8_ = 0;
    auVar20._0_8_ =
         local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar17 = vmovddup_avx512vl(auVar20);
    auVar18 = vmulpd_avx512vl(local_1a0,auVar17);
    local_438[0] = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[2] * local_1e8._0_8_ + auVar18._0_8_ +
                   local_158._0_8_ *
                   local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[8];
    local_438[1] = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[2] * local_1e8._8_8_ + auVar18._8_8_ +
                   local_158._8_8_ *
                   local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[8];
    auVar18 = vmulpd_avx512vl(local_190,auVar17);
    local_438[2] = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[2] * local_1e8._16_8_ + auVar18._0_8_ +
                   local_148._0_8_ *
                   local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[8];
    local_438[3] = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[2] * local_1e8._24_8_ + auVar18._8_8_ +
                   local_148._8_8_ *
                   local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[8];
    auVar18 = vmulpd_avx512vl(local_180,auVar17);
    local_418 = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[2] * local_1c8._0_8_ + auVar18._0_8_ +
                local_138._0_8_ *
                local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[8];
    dStack_410 = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[2] * local_1c8._8_8_ + auVar18._8_8_ +
                 local_138._8_8_ *
                 local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[8];
    auVar18 = vmulpd_avx512vl(local_170,auVar17);
    local_408 = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[2] * local_1b8._0_8_ + auVar18._0_8_ +
                local_128._0_8_ *
                local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[8];
    dStack_400 = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[2] * local_1b8._8_8_ + auVar18._8_8_ +
                 local_128._8_8_ *
                 local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[8];
    auVar17 = vmulsd_avx512f(auVar35,auVar17);
    local_3f8 = local_1a8 *
                local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[2] + auVar17._0_8_ +
                local_118 *
                local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[8];
    if (5 < (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      pdVar12 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      auVar5._8_8_ = 0x3fe0000000000000;
      auVar5._0_8_ = 0x3fe0000000000000;
      auVar18 = vmulpd_avx512vl(*(undefined1 (*) [16])(pdVar12 + 3),auVar5);
      dVar4 = pdVar12[5] * 0.5;
      auVar17 = vshufpd_avx(auVar18,auVar18,1);
      pdVar12 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      lVar14 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
      ;
      lVar15 = 2;
      lVar16 = 0;
      while (lVar15 + -2 < lVar14) {
        dVar2 = *(double *)((long)local_438 + lVar16);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = dVar2;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *(double *)(local_3e8 + lVar16);
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *(double *)(local_3e8 + lVar16) * -dVar4;
        auVar19 = vfmadd231sd_fma(auVar33,auVar17,auVar30);
        pdVar12[lVar15 + -2] = auVar19._0_8_ + pdVar12[lVar15 + -2];
        if (lVar14 <= lVar15 + -1) break;
        dVar3 = *(double *)((long)&local_398.m_xpr + lVar16);
        auVar34._8_8_ = 0;
        auVar34._0_8_ = dVar3;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = dVar4;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = dVar2 * -auVar18._0_8_;
        auVar19 = vfmadd231sd_fma(auVar31,auVar22,auVar34);
        pdVar12[lVar15 + -1] = auVar19._0_8_ + pdVar12[lVar15 + -1];
        if (lVar14 <= lVar15) break;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = dVar3 * -auVar17._0_8_;
        auVar19 = vfmadd213sd_fma(auVar29,auVar18,auVar32);
        pdVar12[lVar15] = auVar19._0_8_ + pdVar12[lVar15];
        lVar15 = lVar15 + 3;
        lVar16 = lVar16 + 8;
        if (lVar15 == 0x1d) {
          auVar21._8_8_ = 0;
          auVar21._0_8_ =
               local_480.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[3];
          auVar23._8_8_ = 0;
          auVar23._0_8_ =
               local_480.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[4];
          auVar25._8_8_ = 0;
          auVar25._0_8_ =
               local_480.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[8];
          auVar27._8_8_ = 0;
          auVar27._0_8_ =
               local_480.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[7];
          auVar28._8_8_ = 0;
          auVar28._0_8_ =
               local_480.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[7] *
               local_480.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[5];
          auVar17 = vfmsub231sd_fma(auVar28,auVar23,auVar25);
          auVar26._8_8_ = 0;
          auVar26._0_8_ =
               local_480.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[6] *
               local_480.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[5];
          auVar18 = vfmsub231sd_fma(auVar26,auVar21,auVar25);
          auVar24._8_8_ = 0;
          auVar24._0_8_ =
               local_480.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[6] *
               local_480.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[4];
          auVar19 = vfmsub231sd_fma(auVar24,auVar21,auVar27);
          *detJ = auVar19._0_8_ *
                  local_480.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                  m_data.array[2] +
                  (auVar17._0_8_ *
                   local_480.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[0] -
                  auVar18._0_8_ *
                  local_480.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                  m_data.array[1]);
          return;
        }
      }
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChElementBeamANCF_3333::ComputeNF(
    const double xi,             // parametric coordinate in volume
    const double eta,            // parametric coordinate in volume
    const double zeta,           // parametric coordinate in volume
    ChVectorDynamic<>& Qi,       // Return result of N'*F  here, maybe with offset block_offset
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is = n.field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    // Compute the generalized force vector for the applied force component using the compact form of the shape
    // functions.  This requires a reshaping of the calculated matrix to get it into the correct vector order (just a
    // reinterpretation of the data since the matrix is in row-major format)
    VectorN Sxi_compact;
    Calc_Sxi_compact(Sxi_compact, xi, eta, zeta);
    MatrixNx3 QiCompact;

    QiCompact = Sxi_compact * F.segment(0, 3).transpose();

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Qi = QiReshaped;

    // Compute the generalized force vector for the applied moment component
    // See: Antonio M Recuero, Javier F Aceituno, Jose L Escalona, and Ahmed A Shabana.
    // A nonlinear approach for modeling rail flexibility using the absolute nodal coordinate
    // formulation. Nonlinear Dynamics, 83(1-2):463-481, 2016.

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    MatrixNx3c Sxi_D;
    Calc_Sxi_D(Sxi_D, xi, eta, zeta);

    ChMatrix33<double> J_Cxi;
    ChMatrix33<double> J_Cxi_Inv;

    J_Cxi.noalias() = e_bar * Sxi_D;
    J_Cxi_Inv = J_Cxi.inverse();

    // Compute the unique pieces that make up the moment projection matrix "G"
    VectorN G_A = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 0) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 0) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 0);
    VectorN G_B = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 1) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 1) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 1);
    VectorN G_C = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 2) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 2) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 2);

    ChVectorN<double, 3> M_scaled = 0.5 * F.segment(3, 3);

    // Compute G'M without actually forming the complete matrix "G" (since it has a sparsity pattern to it)
    for (unsigned int i = 0; i < NSF; i++) {
        Qi(3 * i) += M_scaled(1) * G_C(i) - M_scaled(2) * G_B(i);
        Qi((3 * i) + 1) += M_scaled(2) * G_A(i) - M_scaled(0) * G_C(i);
        Qi((3 * i) + 2) += M_scaled(0) * G_B(i) - M_scaled(1) * G_A(i);
    }

    // Compute the element Jacobian between the current configuration and the normalized configuration
    // This is different than the element Jacobian between the reference configuration and the normalized
    //  configuration used in the internal force calculations.  For this calculation, this is the ratio between the
    //  actual differential volume and the normalized differential volume.  The determinate of the element Jacobian is
    //  used to calculate this volume ratio for potential use in Gauss-Quadrature or similar numeric integration.
    detJ = J_Cxi.determinant();
}